

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall
MemoryManager::setInt(MemoryManager *this,uint32_t addr,uint32_t val,uint32_t *cycles)

{
  bool bVar1;
  uint32_t *in_RCX;
  undefined4 in_EDX;
  uint in_ESI;
  MemoryManager *in_RDI;
  uint8_t val_00;
  
  bVar1 = addrExist((MemoryManager *)CONCAT44(in_ESI,in_EDX),(uint32_t)((ulong)in_RCX >> 0x20));
  val_00 = (uint8_t)((uint)in_EDX >> 0x18);
  if (!bVar1) {
    printf("Memory write to invalid addr 0x%x!\n",(ulong)in_ESI);
    exit(-1);
  }
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  setByte(in_RDI,in_ESI,val_00,in_RCX);
  return true;
}

Assistant:

bool MemoryManager::setInt(uint32_t addr, uint32_t val, uint32_t *cycles) {
//    return setNByte(addr, 4, &val, cycles);
    if (!this->addrExist(addr)) {
        printf("Memory write to invalid addr 0x%x!\n", addr);
        exit(-1);
    }
    this->setByte(addr, val & 0xff, cycles);
    this->setByte(addr + 1, (val >> 8u) & 0xff);
    this->setByte(addr + 2, (val >> 16u) & 0xff);
    this->setByte(addr + 3, (val >> 24u) & 0xff);
    return true;
}